

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O2

void InitThingdef(void)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  AFuncDesc *item;
  NativeCallType call;
  PClass *pPVar4;
  int iVar5;
  PPointer *pPVar6;
  PType *pPVar7;
  PField *pPVar8;
  PArray *pPVar9;
  PNativeStruct *pPVar10;
  PInt **ppPVar11;
  FAutoSegIterator *pFVar12;
  VMNativeFunction *this;
  long lVar13;
  long lVar14;
  FName local_c0;
  FName local_bc;
  FName local_b8;
  FName local_b4;
  FName local_b0;
  FName local_ac;
  FName local_a8;
  FName local_a4;
  FName local_a0;
  FName local_9c;
  long local_98;
  FPropertyInfo *local_90;
  FAutoSegIterator probe_1;
  FName local_70;
  FName local_6c;
  FName local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FAutoSegIterator probe;
  
  pPVar6 = NewPointer((PType *)AActor::RegistrationInfo.MyClass,false);
  FName::FName(&local_4c,"Sector");
  pPVar7 = (PType *)NewNativeStruct(&local_4c,(PTypeBase *)0x0);
  NewPointer(pPVar7,false);
  FName::FName(&local_50,"soundtarget");
  (*(pPVar7->super_PTypeBase).super_DObject._vptr_DObject[0x16])(pPVar7,&local_50,pPVar6,0x108,0);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_9c,"validcount");
  PField::PField(pPVar8,&local_9c,(PType *)TypeSInt32,0x2008,0x7156dc,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_a0,"multiplayer");
  PField::PField(pPVar8,&local_a0,(PType *)TypeBool,0x2018,0x17dbf7b,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  FName::FName(&local_54,"LevelLocals");
  pPVar7 = (PType *)NewNativeStruct(&local_54,(PTypeBase *)0x0);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_a4,"level");
  PField::PField(pPVar8,&local_a4,pPVar7,0x2008,0x17de2b0,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  FName::FName(&local_58,"DehInfo");
  pPVar7 = (PType *)NewNativeStruct(&local_58,(PTypeBase *)0x0);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_a8,"deh");
  PField::PField(pPVar8,&local_a8,pPVar7,0x2008,0x711340,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  FName::FName(&local_5c,"PlayerInfo");
  pPVar7 = (PType *)NewNativeStruct(&local_5c,(PTypeBase *)0x0);
  *(undefined8 *)&(pPVar7->super_PTypeBase).super_DObject.field_0x24 = 0x8000002a0;
  pPVar9 = NewArray(pPVar7,8);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_ac,"players");
  PField::PField(pPVar8,&local_ac,(PType *)pPVar9,0x2008,0x17dbf80,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  FName::FName(&local_60,"Sector");
  pPVar10 = NewNativeStruct(&local_60,(PTypeBase *)0x0);
  FName::FName(&local_64,"lines");
  FName::FName(&local_68,"line");
  pPVar7 = (PType *)NewNativeStruct(&local_68,(PTypeBase *)0x0);
  pPVar6 = NewPointer(pPVar7,false);
  pPVar9 = NewArray((PType *)pPVar6,0x40000);
  pPVar6 = NewPointer((PType *)pPVar9,false);
  (**(code **)((long)(pPVar10->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                     super_PTypeBase.super_DObject._vptr_DObject + 0xb0))
            (pPVar10,&local_64,pPVar6,0x1a0,8);
  pPVar9 = NewArray((PType *)TypeBool,8);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_b0,"playeringame");
  PField::PField(pPVar8,&local_b0,(PType *)pPVar9,0x2018,0x17dd480,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_b4,"gameaction");
  PField::PField(pPVar8,&local_b4,(PType *)TypeUInt8,0x2008,0x17dbf68,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_b8,"consoleplayer");
  PField::PField(pPVar8,&local_b8,(PType *)TypeSInt32,0x2018,0x17dd488,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  if ((InitThingdef()::wpnochg == '\0') &&
     (iVar5 = __cxa_guard_acquire(&InitThingdef()::wpnochg), iVar5 != 0)) {
    InitThingdef::wpnochg = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
    __cxa_guard_release(&InitThingdef()::wpnochg);
  }
  pPVar8 = (PField *)DObject::operator_new(0x40);
  FName::FName(&local_bc,"WP_NOCHANGE");
  pPVar6 = NewPointer((PType *)AWeapon::RegistrationInfo.MyClass,false);
  PField::PField(pPVar8,&local_bc,(PType *)pPVar6,0x2018,0x1c70ed0,0);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar8);
  pPVar4 = AActor::RegistrationInfo.MyClass;
  FName::FName(&local_6c,"DecalGenerator");
  pPVar6 = NewPointer(&TypeVoid->super_PType,false);
  (**(code **)(*(long *)&(pPVar4->super_PNativeStruct).super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0xb0))
            (pPVar4,&local_6c,pPVar6,0x478,0,0);
  for (lVar13 = 0; lVar13 != 0xa8; lVar13 = lVar13 + 0x18) {
    if ((*(byte *)((long)&FlagLists[0].Use + lVar13) & 2) != 0) {
      uVar1 = *(uint *)((long)&FlagLists[0].NumDefs + lVar13);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      local_98 = (ulong)uVar1 << 5;
      for (lVar14 = 0; local_98 != lVar14; lVar14 = lVar14 + 0x20) {
        lVar2 = *(long *)((long)&FlagLists[0].Defs + lVar13);
        if (0 < *(int *)(lVar2 + 0x10 + lVar14)) {
          plVar3 = (long *)**(undefined8 **)((long)&FlagLists[0].Type + lVar13);
          FStringf::FStringf((FStringf *)&probe,"b%s",*(undefined8 *)(lVar2 + 8 + lVar14));
          FName::FName(&local_c0,(FString *)&probe);
          ppPVar11 = &TypeSInt16;
          if (*(int *)(lVar2 + 0x14 + lVar14) == 4) {
            ppPVar11 = &TypeSInt32;
          }
          (**(code **)(*plVar3 + 0xb0))
                    (plVar3,&local_c0,*ppPVar11,(long)*(int *)(lVar2 + 0x10 + lVar14),
                     *(undefined4 *)(lVar2 + 0x18 + lVar14),*(undefined4 *)(lVar2 + lVar14));
          FString::~FString((FString *)&probe);
        }
      }
    }
  }
  probe.Head = &CRegHead;
  probe.Tail = &CRegTail;
  probe.Probe = &CRegHead;
  while (pFVar12 = FAutoSegIterator::operator++(&probe), *pFVar12->Probe != (REGINFO)0x0) {
    if (*(code **)((long)*probe.Probe + 0x30) != (code *)0x0) {
      (**(code **)((long)*probe.Probe + 0x30))();
    }
  }
  for (lVar13 = 0x10; lVar13 != 0xb8; lVar13 = lVar13 + 0x18) {
    qsort(*(void **)(&UNK_00705438 + lVar13),(long)*(int *)((long)&FlagLists[0].Type + lVar13),0x20,
          flagcmp);
  }
  if (properties.Count == 0) {
    probe_1.Head = &GRegHead;
    probe_1.Tail = &GRegTail;
    probe_1.Probe = &GRegHead;
    while (pFVar12 = FAutoSegIterator::operator++(&probe_1), *pFVar12->Probe != (REGINFO)0x0) {
      local_90 = (FPropertyInfo *)*probe_1.Probe;
      TArray<FPropertyInfo_*,_FPropertyInfo_*>::Push(&properties,&local_90);
    }
    TArray<FPropertyInfo_*,_FPropertyInfo_*>::ShrinkToFit(&properties);
    qsort(properties.Array,(ulong)properties.Count,8,propcmp);
  }
  TArray<AFuncDesc,_AFuncDesc>::Clear(&AFTable);
  if (AFTable.Count == 0) {
    probe_1.Head = &ARegHead;
    probe_1.Tail = &ARegTail;
    probe_1.Probe = &ARegHead;
    while (pFVar12 = FAutoSegIterator::operator++(&probe_1), *pFVar12->Probe != (REGINFO)0x0) {
      item = (AFuncDesc *)*probe_1.Probe;
      if (item->VMPointer == (VMNativeFunction **)0x0) {
        __assert_fail("afunc->VMPointer != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_data.cpp"
                      ,0x323,"void InitThingdef()");
      }
      this = (VMNativeFunction *)DObject::operator_new(0x58);
      call = item->Function;
      FName::FName(&local_70,item->FuncName);
      VMNativeFunction::VMNativeFunction(this,call,&local_70);
      *item->VMPointer = this;
      FString::Format(&((*item->VMPointer)->super_VMFunction).PrintableName,"%s.%s [Native]",
                      item->ClassName + 1,item->FuncName);
      TArray<AFuncDesc,_AFuncDesc>::Push(&AFTable,item);
    }
    TArray<AFuncDesc,_AFuncDesc>::ShrinkToFit(&AFTable);
    qsort(AFTable.Array,(ulong)AFTable.Count,0x20,funccmp);
  }
  TArray<FieldDesc,_FieldDesc>::Clear(&FieldTable);
  if (FieldTable.Count == 0) {
    probe_1.Head = &FRegHead;
    probe_1.Tail = &FRegTail;
    probe_1.Probe = &FRegHead;
    while (pFVar12 = FAutoSegIterator::operator++(&probe_1), *pFVar12->Probe != (REGINFO)0x0) {
      TArray<FieldDesc,_FieldDesc>::Push(&FieldTable,(FieldDesc *)*probe_1.Probe);
    }
    TArray<FieldDesc,_FieldDesc>::ShrinkToFit(&FieldTable);
    qsort(FieldTable.Array,(ulong)FieldTable.Count,0x20,fieldcmp);
  }
  return;
}

Assistant:

void InitThingdef()
{
	PType *TypeActor = NewPointer(RUNTIME_CLASS(AActor));

	PStruct *sstruct = NewNativeStruct("Sector", nullptr);
	auto sptr = NewPointer(sstruct);
	sstruct->AddNativeField("soundtarget", TypeActor, myoffsetof(sector_t, SoundTarget));
	
	// expose the global validcount variable.
	PField *vcf = new PField("validcount", TypeSInt32, VARF_Native | VARF_Static, (intptr_t)&validcount);
	GlobalSymbols.AddSymbol(vcf);

	// expose the global Multiplayer variable.
	PField *multif = new PField("multiplayer", TypeBool, VARF_Native | VARF_ReadOnly | VARF_Static, (intptr_t)&multiplayer);
	GlobalSymbols.AddSymbol(multif);

	// set up a variable for the global level data structure
	PStruct *lstruct = NewNativeStruct("LevelLocals", nullptr);
	PField *levelf = new PField("level", lstruct, VARF_Native | VARF_Static, (intptr_t)&level);
	GlobalSymbols.AddSymbol(levelf);

	// set up a variable for the DEH data
	PStruct *dstruct = NewNativeStruct("DehInfo", nullptr);
	PField *dehf = new PField("deh", dstruct, VARF_Native | VARF_Static, (intptr_t)&deh);

	GlobalSymbols.AddSymbol(dehf);

	// set up a variable for the global players array.
	PStruct *pstruct = NewNativeStruct("PlayerInfo", nullptr);
	pstruct->Size = sizeof(player_t);
	pstruct->Align = alignof(player_t);
	PArray *parray = NewArray(pstruct, MAXPLAYERS);
	PField *playerf = new PField("players", parray, VARF_Native | VARF_Static, (intptr_t)&players);
	GlobalSymbols.AddSymbol(playerf);

	// set up the lines array in the sector struct. This is a bit messy because the type system is not prepared to handle a pointer to an array of pointers to a native struct even remotely well...
	// As a result, the size has to be set to something large and arbritrary because it can change between maps. This will need some serious improvement when things get cleaned up.
	pstruct = NewNativeStruct("Sector", nullptr);
	pstruct->AddNativeField("lines", NewPointer(NewArray(NewPointer(NewNativeStruct("line", nullptr), false), 0x40000), false), myoffsetof(sector_t, lines), VARF_Native);

	parray = NewArray(TypeBool, MAXPLAYERS);
	playerf = new PField("playeringame", parray, VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&playeringame);
	GlobalSymbols.AddSymbol(playerf);

	playerf = new PField("gameaction", TypeUInt8, VARF_Native | VARF_Static, (intptr_t)&gameaction);
	GlobalSymbols.AddSymbol(playerf);

	playerf = new PField("consoleplayer", TypeSInt32, VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&consoleplayer);
	GlobalSymbols.AddSymbol(playerf);

	// Argh. It sucks when bad hacks need to be supported. WP_NOCHANGE is just a bogus pointer but it used everywhere as a special flag.
	// It cannot be defined as constant because constants can either be numbers or strings but nothing else, so the only 'solution'
	// is to create a static variable from it and reference that in the script. Yuck!!!
	static AWeapon *wpnochg = WP_NOCHANGE;
	playerf = new PField("WP_NOCHANGE", NewPointer(RUNTIME_CLASS(AWeapon), false), VARF_Native | VARF_Static | VARF_ReadOnly, (intptr_t)&wpnochg);
	GlobalSymbols.AddSymbol(playerf);

	// this needs to be done manually until it can be given a proper type.
	RUNTIME_CLASS(AActor)->AddNativeField("DecalGenerator", NewPointer(TypeVoid), myoffsetof(AActor, DecalGenerator));

	// synthesize a symbol for each flag from the flag name tables to avoid redundant declaration of them.
	for (auto &fl : FlagLists)
	{
		if (fl.Use & 2)
		{
			for(int i=0;i<fl.NumDefs;i++)
			{
				if (fl.Defs[i].structoffset > 0) // skip the deprecated entries in this list
				{
					const_cast<PClass*>(*fl.Type)->AddNativeField(FStringf("b%s", fl.Defs[i].name), (fl.Defs[i].fieldsize == 4 ? TypeSInt32 : TypeSInt16), fl.Defs[i].structoffset, fl.Defs[i].varflags, fl.Defs[i].flagbit);
				}
			}
		}
	}

	FAutoSegIterator probe(CRegHead, CRegTail);

	while (*++probe != NULL)
	{
		if (((ClassReg *)*probe)->InitNatives)
			((ClassReg *)*probe)->InitNatives();
	}

	// Sort the flag lists
	for (size_t i = 0; i < NUM_FLAG_LISTS; ++i)
	{
		qsort (FlagLists[i].Defs, FlagLists[i].NumDefs, sizeof(FFlagDef), flagcmp);
	}

	// Create a sorted list of properties
	if (properties.Size() == 0)
	{
		FAutoSegIterator probe(GRegHead, GRegTail);

		while (*++probe != NULL)
		{
			properties.Push((FPropertyInfo *)*probe);
		}
		properties.ShrinkToFit();
		qsort(&properties[0], properties.Size(), sizeof(properties[0]), propcmp);
	}

	// Create a sorted list of native action functions
	AFTable.Clear();
	if (AFTable.Size() == 0)
	{
		FAutoSegIterator probe(ARegHead, ARegTail);

		while (*++probe != NULL)
		{
			AFuncDesc *afunc = (AFuncDesc *)*probe;
			assert(afunc->VMPointer != NULL);
			*(afunc->VMPointer) = new VMNativeFunction(afunc->Function, afunc->FuncName);
			(*(afunc->VMPointer))->PrintableName.Format("%s.%s [Native]", afunc->ClassName+1, afunc->FuncName);
			AFTable.Push(*afunc);
		}
		AFTable.ShrinkToFit();
		qsort(&AFTable[0], AFTable.Size(), sizeof(AFTable[0]), funccmp);
	}

	FieldTable.Clear();
	if (FieldTable.Size() == 0)
	{
		FAutoSegIterator probe(FRegHead, FRegTail);

		while (*++probe != NULL)
		{
			FieldDesc *afield = (FieldDesc *)*probe;
			FieldTable.Push(*afield);
		}
		FieldTable.ShrinkToFit();
		qsort(&FieldTable[0], FieldTable.Size(), sizeof(FieldTable[0]), fieldcmp);
	}

}